

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# registry.cc
# Opt level: O0

bool __thiscall
prometheus::Registry::NameExistsInOtherType<prometheus::Info>(Registry *this,string *name)

{
  bool bVar1;
  string *name_local;
  Registry *this_local;
  
  bVar1 = (anonymous_namespace)::
          FamilyNameExists<std::vector<std::unique_ptr<prometheus::Family<prometheus::Counter>,std::default_delete<prometheus::Family<prometheus::Counter>>>,std::allocator<std::unique_ptr<prometheus::Family<prometheus::Counter>,std::default_delete<prometheus::Family<prometheus::Counter>>>>>,std::vector<std::unique_ptr<prometheus::Family<prometheus::Gauge>,std::default_delete<prometheus::Family<prometheus::Gauge>>>,std::allocator<std::unique_ptr<prometheus::Family<prometheus::Gauge>,std::default_delete<prometheus::Family<prometheus::Gauge>>>>>const&,std::vector<std::unique_ptr<prometheus::Family<prometheus::Histogram>,std::default_delete<prometheus::Family<prometheus::Histogram>>>,std::allocator<std::unique_ptr<prometheus::Family<prometheus::Histogram>,std::default_delete<prometheus::Family<prometheus::Histogram>>>>>const&,std::vector<std::unique_ptr<prometheus::Family<prometheus::Summary>,std::default_delete<prometheus::Family<prometheus::Summary>>>,std::allocator<std::unique_ptr<prometheus::Family<prometheus::Summary>,std::default_delete<prometheus::Family<prometheus::Summary>>>>>const&>
                    (name,&this->counters_,&this->gauges_,&this->histograms_,&this->summaries_);
  return bVar1;
}

Assistant:

bool Registry::NameExistsInOtherType<Info>(const std::string& name) const {
  return FamilyNameExists(name, counters_, gauges_, histograms_, summaries_);
}